

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

FlagRegistry * gflags::anon_unknown_2::FlagRegistry::GlobalRegistry(void)

{
  FlagRegistry *pFVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  
  if ((anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock);
    if (iVar2 != 0) {
      GlobalRegistry::lock.mutex_ = 0;
      __cxa_atexit(gflags_mutex_namespace::Mutex::~Mutex,&GlobalRegistry::lock,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock);
    }
  }
  gflags_mutex_namespace::Mutex::Lock(&GlobalRegistry::lock);
  if ((anonymous_namespace)::FlagRegistry::global_registry_ == (FlagRegistry *)0x0) {
    (anonymous_namespace)::FlagRegistry::global_registry_ = (FlagRegistry *)operator_new(0x68);
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
              super__Rb_tree_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
    p_Var3 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
              super__Rb_tree_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
    ((anonymous_namespace)::FlagRegistry::global_registry_->lock_).mutex_ = 0;
  }
  pFVar1 = (anonymous_namespace)::FlagRegistry::global_registry_;
  gflags_mutex_namespace::Mutex::Unlock(&GlobalRegistry::lock);
  return pFVar1;
}

Assistant:

FlagRegistry* FlagRegistry::GlobalRegistry() {
  static Mutex lock(Mutex::LINKER_INITIALIZED);
  MutexLock acquire_lock(&lock);
  if (!global_registry_) {
    global_registry_ = new FlagRegistry;
  }
  return global_registry_;
}